

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

BIT_DStream_status BIT_reloadDStream(BIT_DStream_t *bitD)

{
  size_t sVar1;
  bool bVar2;
  BIT_DStream_status local_20;
  uint local_1c;
  BIT_DStream_status result;
  U32 nbBytes;
  BIT_DStream_t *bitD_local;
  
  if (bitD->bitsConsumed < 0x41) {
    if (bitD->ptr < bitD->limitPtr) {
      if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < 0x40) {
          bitD_local._4_4_ = BIT_DStream_endOfBuffer;
        }
        else {
          bitD_local._4_4_ = BIT_DStream_completed;
        }
      }
      else {
        local_1c = bitD->bitsConsumed >> 3;
        bVar2 = bitD->ptr + -(ulong)local_1c < bitD->start;
        if (bVar2) {
          local_1c = (int)bitD->ptr - (int)bitD->start;
        }
        local_20 = (BIT_DStream_status)bVar2;
        bitD->ptr = bitD->ptr + -(ulong)local_1c;
        bitD->bitsConsumed = bitD->bitsConsumed + local_1c * -8;
        sVar1 = MEM_readLEST(bitD->ptr);
        bitD->bitContainer = sVar1;
        bitD_local._4_4_ = local_20;
      }
    }
    else {
      bitD_local._4_4_ = BIT_reloadDStreamFast(bitD);
    }
  }
  else {
    bitD_local._4_4_ = BIT_DStream_overflow;
  }
  return bitD_local._4_4_;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        return BIT_reloadDStreamFast(bitD);
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}